

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fLayoutBindingTests.cpp
# Opt level: O3

string * deqp::gles31::Functional::anon_unknown_1::generateTessEvaluationShader
                   (string *__return_storage_ptr__,ShaderType shaderType,
                   string *shaderUniformDeclarations,string *shaderBody)

{
  ostream *poVar1;
  string *psVar2;
  string *extraout_RAX;
  char *pcVar3;
  char *pcVar4;
  ostringstream tessEvaluationShaderSource;
  undefined1 auStack_198 [376];
  
  if (shaderType < SHADERTYPE_TESS_EVALUATION) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar4 = 
    "#version 310 es\n#extension GL_EXT_tessellation_shader : require\nlayout (triangles) in;\n\nvoid main (void)\n{\n\tgl_Position = gl_TessCoord[0] * gl_in[0].gl_Position + gl_TessCoord[1] * gl_in[1].gl_Position + gl_TessCoord[2] * gl_in[2].gl_Position;\n}\n"
    ;
    pcVar3 = "";
  }
  else {
    if (shaderType - SHADERTYPE_TESS_EVALUATION < 2) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_198);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)auStack_198,"#version 310 es\n",0x10);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)auStack_198,"#extension GL_EXT_tessellation_shader : require\n",0x30);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)auStack_198,"layout (triangles) in;\n",0x17);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_198,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)auStack_198,"uniform highp int u_arrayNdx;\n\n",0x1f);
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)auStack_198,(shaderUniformDeclarations->_M_dataplus)._M_p,
                          shaderUniformDeclarations->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"out mediump vec4 v_color;\n",0x1a);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"void main (void)\n",0x11);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"{\n",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\thighp vec4 color;\n\n",0x14);
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar1,(shaderBody->_M_dataplus)._M_p,shaderBody->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\tv_color = color;\n",0x12);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar1,
                 "\tgl_Position = gl_TessCoord[0] * gl_in[0].gl_Position + gl_TessCoord[1] * gl_in[1].gl_Position + gl_TessCoord[2] * gl_in[2].gl_Position;\n"
                 ,0x89);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"}\n",2);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_198);
      psVar2 = (string *)std::ios_base::~ios_base((ios_base *)(auStack_198 + 0x70));
      return psVar2;
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = "";
    pcVar4 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar4,pcVar3);
  return extraout_RAX;
}

Assistant:

std::string generateTessEvaluationShader (ShaderType shaderType, const std::string& shaderUniformDeclarations, const std::string& shaderBody)
{
	static const char* const s_simpleTessEvaluationShaderSource =	"#version 310 es\n"
																	"#extension GL_EXT_tessellation_shader : require\n"
																	"layout (triangles) in;\n"
																	"\n"
																	"void main (void)\n"
																	"{\n"
																	"	gl_Position = gl_TessCoord[0] * gl_in[0].gl_Position + gl_TessCoord[1] * gl_in[1].gl_Position + gl_TessCoord[2] * gl_in[2].gl_Position;\n"
																	"}\n";

	switch (shaderType)
	{
		case SHADERTYPE_VERTEX:
		case SHADERTYPE_FRAGMENT:
		case SHADERTYPE_TESS_CONTROL:
			return s_simpleTessEvaluationShaderSource;

		case SHADERTYPE_TESS_EVALUATION:
		case SHADERTYPE_ALL:
		{
			std::ostringstream tessEvaluationShaderSource;
			tessEvaluationShaderSource	<< "#version 310 es\n"
										<< "#extension GL_EXT_tessellation_shader : require\n"
										<< "layout (triangles) in;\n"
										<< "\n"
										<< "uniform highp int u_arrayNdx;\n\n"
										<< shaderUniformDeclarations << "\n"
										<< "out mediump vec4 v_color;\n"
										<< "void main (void)\n"
										<< "{\n"
										<< "	highp vec4 color;\n\n"
										<<	shaderBody << "\n"
										<< "	v_color = color;\n"
										<< "	gl_Position = gl_TessCoord[0] * gl_in[0].gl_Position + gl_TessCoord[1] * gl_in[1].gl_Position + gl_TessCoord[2] * gl_in[2].gl_Position;\n"
										<< "}\n";

			return tessEvaluationShaderSource.str();
		}

		default:
			DE_ASSERT(false);
			return "";
	}
}